

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ratio.cpp
# Opt level: O1

string * __thiscall
Ratio::toStringVerbose
          (string *__return_storage_ptr__,Ratio *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *leaf2NumMap)

{
  pointer puVar1;
  bool bVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  pointer pPVar6;
  long lVar7;
  ostringstream ss;
  string local_2b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_298;
  string *local_290;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_288;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_270;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_258;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_238;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_218;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  long local_1a8;
  undefined8 local_1a0 [2];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  local_298 = leaf2NumMap;
  local_290 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)((long)local_1a0 + *(long *)(local_1a8 + -0x18)) = 8;
  poVar3 = std::ostream::_M_insert<double>(this->eLength / this->fLength);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"Total length and corresponding edges dropped:",0x2d);
  std::ios::widen((char)(ostream *)&local_1a8 + (char)*(undefined8 *)(local_1a8 + -0x18));
  std::ostream::put((char)&local_1a8);
  std::ostream::flush();
  poVar3 = std::ostream::_M_insert<double>(this->eLength);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t",1);
  pPVar6 = (this->eEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->eEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
      super__Vector_impl_data._M_finish != pPVar6) {
    lVar7 = 0;
    uVar5 = 0;
    do {
      if (lVar7 == 0) {
        Bipartition::getPartition(&local_238,&pPVar6->super_Bipartition);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_270,local_298);
        Bipartition::toStringVerbose(&local_2b8,&local_238,&local_270);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1a8,local_2b8._M_dataplus._M_p,
                            local_2b8._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_270);
        bVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                m_check_invariants(&local_238);
        puVar1 = local_238.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\t\t",2);
        Bipartition::getPartition
                  (&local_1f8,
                   (Bipartition *)
                   ((long)&(((this->eEdges).
                             super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                             _M_impl.super__Vector_impl_data._M_start)->super_Bipartition).
                           _vptr_Bipartition + lVar7));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_1c0,local_298);
        Bipartition::toStringVerbose(&local_2b8,&local_1f8,&local_1c0);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1a8,local_2b8._M_dataplus._M_p,
                            local_2b8._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1c0);
        bVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                m_check_invariants(&local_1f8);
        puVar1 = local_1f8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      }
      if (!bVar2) goto LAB_0012d8dd;
      if (puVar1 != (pointer)0x0) {
        operator_delete(puVar1);
      }
      uVar5 = uVar5 + 1;
      pPVar6 = (this->eEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar4 = ((long)(this->eEdges).
                     super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pPVar6 >> 3) * -0x71c71c71c71c71c7;
      lVar7 = lVar7 + 0x48;
    } while (uVar5 <= uVar4 && uVar4 - uVar5 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"\nTotal length and corresponding edges added:",0x2c);
  std::ios::widen((char)(ostream *)&local_1a8 + (char)*(undefined8 *)(local_1a8 + -0x18));
  std::ostream::put((char)&local_1a8);
  std::ostream::flush();
  poVar3 = std::ostream::_M_insert<double>(this->fLength);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t",1);
  pPVar6 = (this->fEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->fEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
      super__Vector_impl_data._M_finish != pPVar6) {
    lVar7 = 0;
    uVar5 = 0;
    do {
      if (lVar7 == 0) {
        Bipartition::getPartition(&local_258,&pPVar6->super_Bipartition);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_288,local_298);
        Bipartition::toStringVerbose(&local_2b8,&local_258,&local_288);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1a8,local_2b8._M_dataplus._M_p,
                            local_2b8._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_288);
        bVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                m_check_invariants(&local_258);
        puVar1 = local_258.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\t\t",2);
        Bipartition::getPartition
                  (&local_218,
                   (Bipartition *)
                   ((long)&(((this->fEdges).
                             super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                             _M_impl.super__Vector_impl_data._M_start)->super_Bipartition).
                           _vptr_Bipartition + lVar7));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_1d8,local_298);
        Bipartition::toStringVerbose(&local_2b8,&local_218,&local_1d8);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1a8,local_2b8._M_dataplus._M_p,
                            local_2b8._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1d8);
        bVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                m_check_invariants(&local_218);
        puVar1 = local_218.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      }
      if (!bVar2) {
LAB_0012d8dd:
        __assert_fail("m_check_invariants()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/boost/dynamic_bitset/dynamic_bitset.hpp"
                      ,0x279,
                      "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                     );
      }
      if (puVar1 != (pointer)0x0) {
        operator_delete(puVar1);
      }
      uVar5 = uVar5 + 1;
      pPVar6 = (this->fEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar4 = ((long)(this->fEdges).
                     super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pPVar6 >> 3) * -0x71c71c71c71c71c7;
      lVar7 = lVar7 + 0x48;
    } while (uVar5 <= uVar4 && uVar4 - uVar5 != 0);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  return local_290;
}

Assistant:

string Ratio::toStringVerbose(const vector<string>& leaf2NumMap) {
    std::ostringstream ss;
    ss << std::fixed << std::setprecision(8);

    ss << getRatio() << endl;

    ss << "Total length and corresponding edges dropped:" << endl;

    ss << eLength << "\t";

    // list the edges dropped
    for (int i = 0; i < eEdges.size(); i++) {
        if (i == 0) {   // nice formatting
            ss << Bipartition::toStringVerbose(eEdges[i].getPartition(), leaf2NumMap) << endl;
        } else {
            ss << "\t\t" << Bipartition::toStringVerbose(eEdges[i].getPartition(), leaf2NumMap) << endl;
        }
    }

    ss << "\nTotal length and corresponding edges added:" << endl;

    ss << fLength << "\t";

    // list the edges added
    for (int i = 0; i < fEdges.size(); i++) {
        if (i == 0) {   // nice formatting
            ss << Bipartition::toStringVerbose(fEdges[i].getPartition(), leaf2NumMap) << endl;
        } else {
            ss << "\t\t" << Bipartition::toStringVerbose(fEdges[i].getPartition(), leaf2NumMap) << endl;
        }
    }

    return ss.str();

}